

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

string * __thiscall
SchemeChar::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeChar *this)

{
  allocator local_51;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,"#\\",&local_51);
  char_to_char_name_abi_cxx11_(&local_50,this->value);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeChar::external_repr() const
{
    return std::string("#\\") + char_to_char_name(value);
}